

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::NegativeLinkErrors::Link(NegativeLinkErrors *this,string *vs,string *fs)

{
  GLuint program;
  GLuint shader;
  GLuint shader_00;
  CallLogWrapper *this_00;
  char *format;
  bool bVar1;
  GLint status;
  char *fssrc;
  char *vssrc;
  GLchar log [1024];
  int local_43c;
  pointer local_438;
  pointer local_430;
  GLchar local_428 [1024];
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  local_430 = (vs->_M_dataplus)._M_p;
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&local_430,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  shader_00 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader_00);
  glu::CallLogWrapper::glDeleteShader(this_00,shader_00);
  local_438 = (fs->_M_dataplus)._M_p;
  glu::CallLogWrapper::glShaderSource(this_00,shader_00,1,&local_438,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader_00);
  glu::CallLogWrapper::glGetShaderiv(this_00,shader,0x8b81,&local_43c);
  if (local_43c == 0) {
    glu::CallLogWrapper::glDeleteProgram(this_00,program);
    format = "VS compilation should be ok.\n";
  }
  else {
    glu::CallLogWrapper::glGetShaderiv(this_00,shader_00,0x8b81,&local_43c);
    if (local_43c != 0) {
      glu::CallLogWrapper::glLinkProgram(this_00,program);
      glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,0x400,(GLsizei *)0x0,local_428);
      anon_unknown_0::Output("Program Info Log:\n%s\n",local_428);
      glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&local_43c);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      bVar1 = local_43c != 1;
      if (bVar1) {
        return bVar1;
      }
      format = "Link operation should fail.\n";
      goto LAB_009cdc04;
    }
    glu::CallLogWrapper::glDeleteProgram(this_00,program);
    format = "FS compilation should be ok.\n";
  }
  bVar1 = false;
LAB_009cdc04:
  anon_unknown_0::Output(format);
  return bVar1;
}

Assistant:

bool Link(const std::string& vs, const std::string& fs)
	{
		const GLuint p = glCreateProgram();

		const GLuint vsh = glCreateShader(GL_VERTEX_SHADER);
		glAttachShader(p, vsh);
		glDeleteShader(vsh);
		const char* const vssrc = vs.c_str();
		glShaderSource(vsh, 1, &vssrc, NULL);
		glCompileShader(vsh);

		const GLuint fsh = glCreateShader(GL_FRAGMENT_SHADER);
		glAttachShader(p, fsh);
		glDeleteShader(fsh);
		const char* const fssrc = fs.c_str();
		glShaderSource(fsh, 1, &fssrc, NULL);
		glCompileShader(fsh);

		GLint status;
		glGetShaderiv(vsh, GL_COMPILE_STATUS, &status);
		if (status == GL_FALSE)
		{
			glDeleteProgram(p);
			Output("VS compilation should be ok.\n");
			return false;
		}
		glGetShaderiv(fsh, GL_COMPILE_STATUS, &status);
		if (status == GL_FALSE)
		{
			glDeleteProgram(p);
			Output("FS compilation should be ok.\n");
			return false;
		}

		glLinkProgram(p);

		GLchar log[1024];
		glGetProgramInfoLog(p, sizeof(log), NULL, log);
		Output("Program Info Log:\n%s\n", log);

		glGetProgramiv(p, GL_LINK_STATUS, &status);
		glDeleteProgram(p);

		if (status == GL_TRUE)
		{
			Output("Link operation should fail.\n");
			return false;
		}

		return true;
	}